

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

BOOL macro_sub(List *ls,SymbolTable *sym,BOOL flag_failure)

{
  SymbolInfo ls_00;
  HashErr HVar1;
  BOOL BVar2;
  char *pcVar3;
  char local_458 [8];
  char buf [1024];
  char *name;
  SymbolInfo info;
  List *op;
  List *new;
  List *best;
  Macro *m;
  SymbolTable *pSStack_20;
  BOOL flag_failure_local;
  SymbolTable *sym_local;
  List *ls_local;
  
  new = (List *)0x0;
  info.n = 0;
  m._4_4_ = flag_failure;
  pSStack_20 = sym;
  sym_local = (SymbolTable *)ls;
  if ((ls->token).type == TOK_LIST) {
    if (ls->car == (ListStruct *)0x0) {
      if (flag_failure != FALSE) {
        parse_error(ls,"Macro name is missing!\n");
      }
      return FALSE;
    }
    if ((ls->car->token).type == TOK_IDENTIFIER) {
      buf._1016_8_ = (ls->car->token).u;
    }
    else {
      info = (SymbolInfo)ls->car;
      buf[0x3f8] = '\0';
      buf[0x3f9] = '\0';
      buf[0x3fa] = '\0';
      buf[0x3fb] = '\0';
      buf[0x3fc] = '\0';
      buf[0x3fd] = '\0';
      buf[0x3fe] = '\0';
      buf[0x3ff] = '\0';
    }
  }
  else if ((ls->token).type == TOK_IDENTIFIER) {
    buf._1016_8_ = (ls->token).u;
  }
  else {
    buf[0x3f8] = '\0';
    buf[0x3f9] = '\0';
    buf[0x3fa] = '\0';
    buf[0x3fb] = '\0';
    buf[0x3fc] = '\0';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
    info = (SymbolInfo)ls;
  }
  HVar1 = lookup_symbol(sym,(char *)buf._1016_8_,(SymbolInfo *)&name,(char **)0x0);
  ls_00 = info;
  if (HVar1 == HASH_NOTFOUND) {
    if (m._4_4_ != FALSE) {
      if (buf._1016_8_ == 0) {
        if (info.n == 0) {
          parse_error((List *)sym_local,"Unknown operator.\n");
        }
        else {
          pcVar3 = unparse_token((Token *)(info.n + 0x10),local_458);
          parse_error((List *)ls_00.p,"Unknown operator \"%s\"\n",pcVar3);
        }
      }
      else {
        parse_error((List *)sym_local,"Unknown operator \"%s\".\n",buf._1016_8_);
      }
    }
    ls_local._4_4_ = FALSE;
  }
  else {
    new = (List *)0x0;
    for (best = (List *)name; best != (List *)0x0; best = best->car) {
      BVar2 = better_match((List *)sym_local,best->cdr,new);
      if (BVar2 != FALSE) {
        new = best->cdr;
      }
    }
    if (new == (List *)0x0) {
      if (m._4_4_ != FALSE) {
        parse_error((List *)sym_local,
                    "No applicable version of the \"%s\" macro exists for these arguments.\n",
                    buf._1016_8_);
      }
      ls_local._4_4_ = FALSE;
    }
    else if (*(int *)(sym_local->bucket + 2) == 0x4c) {
      op = copy_list(new->cdr);
      substitute_args(*(List **)sym_local->bucket[1],new->car->cdr,op);
      replace_list((List *)sym_local,op);
      ls_local._4_4_ = TRUE;
    }
    else {
      if (new->cdr == (ListStruct *)0x0) {
        *(undefined4 *)(sym_local->bucket + 2) = 0x4e;
      }
      else if ((new->cdr->cdr == (ListStruct *)0x0) && ((new->cdr->token).type != TOK_LIST)) {
        *(TokenType *)(sym_local->bucket + 2) = (new->cdr->token).type;
        *(anon_union_8_7_0ba269be_for_u *)(sym_local->bucket + 3) = (new->cdr->token).u;
      }
      else {
        op = copy_list(new->cdr);
        propagate_fileinfo((Token *)(sym_local->bucket + 2),op);
        replace_list((List *)sym_local,op);
      }
      ls_local._4_4_ = TRUE;
    }
  }
  return ls_local._4_4_;
}

Assistant:

BOOL
macro_sub (List *ls, const SymbolTable *sym, BOOL flag_failure)
{
  const Macro *m;
  List *best = NULL, *new, *op;
  SymbolInfo info;
  const char *name;

#ifdef DEBUG
  printf ("macro_sub: "); print_list (ls, stdout); putchar ('\n');
#endif


  /* Get the name of the macro to be expanded. */
  op = NULL;
  if (ls->token.type == TOK_LIST)
    {
      if (ls->car == NULL)
	{
	  if (flag_failure)
	    parse_error (ls, "Macro name is missing!\n");
	  return FALSE;
	}
      if (ls->car->token.type == TOK_IDENTIFIER)
	name = ls->car->token.u.string;
      else
	{
	  op = ls->car;
	  name = NULL;
	}
    }
  else if (ls->token.type == TOK_IDENTIFIER)
    name = ls->token.u.string;
  else
    {
      op = ls;
      name = NULL;
    }

  /* Look up the macro list in the symbol table. */
  if (lookup_symbol (sym, name, &info, NULL) == HASH_NOTFOUND)
    {
      if (flag_failure)
	{
	  char buf[1024];
	  if (name == NULL)
	    {
	      if (op != NULL)
		parse_error (op, "Unknown operator \"%s\"\n",
			     unparse_token (&op->token, buf));
	      else
		parse_error (ls, "Unknown operator.\n");
	    }
	  else
	    parse_error (ls, "Unknown operator \"%s\".\n", name);
	}
      return FALSE;
    }
  m = (const Macro *) info.p;


  /* Now we have a list of macros and we have to choose the best match by the
   * following heuristics, in order:
   *  (1) Invocation form matching.  "foo" and "(foo)" can only match
   *      (define foo ...) and (define (foo) ...), respectively.
   *  (2) The number of arguments must match.  Note that the "+tail" construct
   *      can allow an arbitrarily high number of arguments.
   *  (3) All literals must match (see 3, below)
   *  (4) Number of literal matches.  For example, it is legal to both
   *      (define (foo a1 a2 0) x) and (define (foo a1 a2 a3) y).  In this
   *      example, an invocation of (foo 2 1 0) would expand to x.
   *  (5) Larger number of arguments.  Whichever macro names the most arguments
   *      (disregarding any "+tail", of course) will be preferred.
   *  (6) Prefer the macro without a "+tail".
   *  (7) Lexical predecence.  In case of a tie, the first macro defined will
   *      be chosen.
   */

  /* Find the best match. */
  for (best = NULL; m != NULL; m = m->next)
    if (better_match (ls, m->expr, best))
      best = m->expr;

  /* Was there no match at all? */
  if (best == NULL)
    {
      if (flag_failure)
	parse_error (ls, "No applicable version of the \"%s\" macro exists "
		     "for these arguments.\n", name);
      return FALSE;
    }

  /* Is this simple substitution (ie, no macro arguments, etc.) */
  if (ls->token.type != TOK_LIST)
    {
      if (best->cdr == NULL)  /* Empty list? */
	ls->token.type = TOK_EMPTY;
      else if (CDDR (best) == NULL && best->cdr->token.type != TOK_LIST)
	{
	  ls->token.type = best->cdr->token.type;
	  ls->token.u    = best->cdr->token.u;
	}
      else
	{
	  new = copy_list (best->cdr);
	  propagate_fileinfo (&ls->token, new);  /* So we don't forget... */
	  replace_list (ls, new);
	}

      return TRUE;
    }

  /* It's a complicate macro with arguments.  Substitute in the arguments. */
  new = copy_list (best->cdr);
  substitute_args (CDAR (ls), CDAR (best), new);
  replace_list (ls, new);

  return TRUE;
}